

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O1

void __thiscall
irr::core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::push_back
          (array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute> *this,
          SAttribute *element)

{
  uint uVar1;
  SAttribute *pSVar2;
  SAttribute e;
  string<unsigned_long> local_48;
  string<unsigned_long> local_38;
  
  uVar1 = this->used;
  if (this->allocated < uVar1 + 1) {
    local_48.array = (unsigned_long *)0x0;
    local_48.allocated = 1;
    local_48.used = 1;
    local_48.array = (unsigned_long *)operator_new__(8);
    *local_48.array = 0;
    local_38.array = (unsigned_long *)0x0;
    local_38.allocated = 1;
    local_38.used = 1;
    local_38.array = (unsigned_long *)operator_new__(8);
    *local_38.array = 0;
    string<unsigned_long>::operator=(&local_48,&element->Name);
    string<unsigned_long>::operator=(&local_38,&element->Value);
    reallocate(this,this->used * 2 + 1);
    uVar1 = this->used;
    this->used = uVar1 + 1;
    pSVar2 = this->data;
    string<unsigned_long>::operator=(&pSVar2[uVar1].Name,&local_48);
    string<unsigned_long>::operator=(&pSVar2[uVar1].Value,&local_38);
    this->is_sorted = false;
    if (local_38.array != (unsigned_long *)0x0) {
      operator_delete__(local_38.array);
    }
    if (local_48.array != (unsigned_long *)0x0) {
      operator_delete__(local_48.array);
    }
  }
  else {
    pSVar2 = this->data;
    this->used = uVar1 + 1;
    string<unsigned_long>::operator=(&pSVar2[uVar1].Name,&element->Name);
    string<unsigned_long>::operator=(&pSVar2[uVar1].Value,&element->Value);
    this->is_sorted = false;
  }
  return;
}

Assistant:

void push_back(const T& element)
	{
		if (used + 1 > allocated)
		{
			// reallocate(used * 2 +1);
			// this doesn't work if the element is in the same array. So
			// we'll copy the element first to be sure we'll get no data
			// corruption

			T e;
			e = element;           // copy element
			reallocate(used * 2 +1); // increase data block
			data[used++] = e;        // push_back
			is_sorted = false; 
			return;
		}

		data[used++] = element;
		is_sorted = false;
	}